

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnmdec.c
# Opt level: O0

size_t ReadPAMFields(PNMInfo *info,size_t off)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ushort **ppuVar4;
  char *pcVar5;
  char *pcVar6;
  size_t in_RSI;
  undefined8 *in_RDI;
  char *pcVar7;
  char *pcVar8;
  int i;
  size_t kLen;
  int expected_depth;
  int tmp;
  size_t out_size;
  char out [1025];
  int local_444;
  uint local_438;
  undefined4 local_434;
  ulong local_430;
  char local_428 [15];
  char acStack_419 [1025];
  size_t local_18;
  undefined8 *local_10;
  
  local_438 = 0xffffffff;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  local_18 = ReadLine((uint8_t *)*local_10,local_18,local_10[1],local_428,&local_430
                                     );
                  if (local_18 == 0) {
                    return 0;
                  }
                  iVar1 = __isoc99_sscanf(local_428,"WIDTH %d",&local_434);
                  if (iVar1 != 1) break;
                  if ((*(uint *)(local_10 + 5) & 1) != 0) {
                    sVar2 = FlagError((char *)0x10768d);
                    return sVar2;
                  }
                  *(uint *)(local_10 + 5) = *(uint *)(local_10 + 5) | 1;
                  *(undefined4 *)(local_10 + 2) = local_434;
                }
                iVar1 = __isoc99_sscanf(local_428,"HEIGHT %d",&local_434);
                if (iVar1 != 1) break;
                if ((*(uint *)(local_10 + 5) & 2) != 0) {
                  sVar2 = FlagError((char *)0x1076fb);
                  return sVar2;
                }
                *(uint *)(local_10 + 5) = *(uint *)(local_10 + 5) | 2;
                *(undefined4 *)((long)local_10 + 0x14) = local_434;
              }
              iVar1 = __isoc99_sscanf(local_428,"DEPTH %d",&local_434);
              if (iVar1 != 1) break;
              if ((*(uint *)(local_10 + 5) & 4) != 0) {
                sVar2 = FlagError((char *)0x107769);
                return sVar2;
              }
              *(uint *)(local_10 + 5) = *(uint *)(local_10 + 5) | 4;
              *(undefined4 *)((long)local_10 + 0x1c) = local_434;
            }
            iVar1 = __isoc99_sscanf(local_428,"MAXVAL %d",&local_434);
            if (iVar1 != 1) break;
            if ((*(uint *)(local_10 + 5) & 8) != 0) {
              sVar2 = FlagError((char *)0x1077d7);
              return sVar2;
            }
            *(uint *)(local_10 + 5) = *(uint *)(local_10 + 5) | 8;
            *(undefined4 *)(local_10 + 4) = local_434;
          }
          iVar1 = strcmp(local_428,"TUPLTYPE RGB_ALPHA");
          if (iVar1 != 0) break;
          local_438 = 4;
          *(uint *)(local_10 + 5) = *(uint *)(local_10 + 5) | 0x10;
        }
        iVar1 = strcmp(local_428,"TUPLTYPE RGB");
        if (iVar1 != 0) break;
        local_438 = 3;
        *(uint *)(local_10 + 5) = *(uint *)(local_10 + 5) | 0x10;
      }
      iVar1 = strcmp(local_428,"TUPLTYPE GRAYSCALE_ALPHA");
      if (iVar1 != 0) break;
      local_438 = 2;
      *(uint *)(local_10 + 5) = *(uint *)(local_10 + 5) | 0x10;
    }
    iVar1 = strcmp(local_428,"TUPLTYPE GRAYSCALE");
    if (iVar1 != 0) break;
    local_438 = 1;
    *(uint *)(local_10 + 5) = *(uint *)(local_10 + 5) | 0x10;
  }
  iVar1 = strcmp(local_428,"ENDHDR");
  if (iVar1 != 0) {
    if (0x14 < local_430) {
      snprintf(acStack_419,5," ...");
    }
    for (local_444 = 0; sVar3 = strlen(local_428), local_444 < (int)sVar3; local_444 = local_444 + 1
        ) {
      ppuVar4 = __ctype_b_loc();
      if (((*ppuVar4)[(int)local_428[local_444]] & 0x4000) == 0) {
        local_428[local_444] = ' ';
      }
    }
    fprintf(stderr,"PAM header error: unrecognized entry [%s]\n",local_428);
    return 0;
  }
  if ((*(uint *)(local_10 + 5) & 0xf) == 0) {
    pcVar6 = " WIDTH";
    if ((*(uint *)(local_10 + 5) & 1) != 0) {
      pcVar6 = "";
    }
    pcVar5 = " HEIGHT";
    if ((*(uint *)(local_10 + 5) & 2) != 0) {
      pcVar5 = "";
    }
    pcVar7 = " DEPTH";
    if ((*(uint *)(local_10 + 5) & 4) != 0) {
      pcVar7 = "";
    }
    pcVar8 = " MAXVAL";
    if ((*(uint *)(local_10 + 5) & 8) != 0) {
      pcVar8 = "";
    }
    fprintf(stderr,"PAM header error: missing tags%s%s%s%s\n",pcVar6,pcVar5,pcVar7,pcVar8);
    return 0;
  }
  if ((local_438 != 0xffffffff) && (*(uint *)((long)local_10 + 0x1c) != local_438)) {
    fprintf(stderr,"PAM header error: expected DEPTH %d but got DEPTH %d\n",(ulong)local_438,
            (ulong)*(uint *)((long)local_10 + 0x1c));
    return 0;
  }
  return local_18;
}

Assistant:

static size_t ReadPAMFields(PNMInfo* const info, size_t off) {
  char out[MAX_LINE_SIZE + 1];
  size_t out_size;
  int tmp;
  int expected_depth = -1;
  assert(info != NULL);
  while (1) {
    off = ReadLine(info->data, off, info->data_size, out, &out_size);
    if (off == 0) return 0;
    if (sscanf(out, "WIDTH %d", &tmp) == 1) {
      if (info->seen_flags & WIDTH_FLAG) return FlagError("WIDTH");
      info->seen_flags |= WIDTH_FLAG;
      info->width = tmp;
    } else if (sscanf(out, "HEIGHT %d", &tmp) == 1) {
      if (info->seen_flags & HEIGHT_FLAG) return FlagError("HEIGHT");
      info->seen_flags |= HEIGHT_FLAG;
      info->height = tmp;
    } else if (sscanf(out, "DEPTH %d", &tmp) == 1) {
      if (info->seen_flags & DEPTH_FLAG) return FlagError("DEPTH");
      info->seen_flags |= DEPTH_FLAG;
      info->depth = tmp;
    } else if (sscanf(out, "MAXVAL %d", &tmp) == 1) {
      if (info->seen_flags & MAXVAL_FLAG) return FlagError("MAXVAL");
      info->seen_flags |= MAXVAL_FLAG;
      info->max_value = tmp;
    } else if (!strcmp(out, "TUPLTYPE RGB_ALPHA")) {
      expected_depth = 4;
      info->seen_flags |= TUPLE_FLAG;
    } else if (!strcmp(out, "TUPLTYPE RGB")) {
      expected_depth = 3;
      info->seen_flags |= TUPLE_FLAG;
    } else if (!strcmp(out, "TUPLTYPE GRAYSCALE_ALPHA")) {
      expected_depth = 2;
      info->seen_flags |= TUPLE_FLAG;
    } else if (!strcmp(out, "TUPLTYPE GRAYSCALE")) {
      expected_depth = 1;
      info->seen_flags |= TUPLE_FLAG;
    } else if (!strcmp(out, "ENDHDR")) {
      break;
    } else {
      static const char kEllipsis[] = " ...";
      const size_t kLen = strlen(kEllipsis) + 1;  // +1 = trailing \0
      int i;
      if (out_size > 20) snprintf(out + 20 - kLen, kLen, kEllipsis);
      for (i = 0; i < (int)strlen(out); ++i) {
        // isprint() might trigger a "char-subscripts" warning if given a char.
        if (!isprint((int)out[i])) out[i] = ' ';
      }
      fprintf(stderr, "PAM header error: unrecognized entry [%s]\n", out);
      return 0;
    }
  }
  if (!(info->seen_flags & ALL_NEEDED_FLAGS)) {
    fprintf(stderr, "PAM header error: missing tags%s%s%s%s\n",
            (info->seen_flags & WIDTH_FLAG) ? "" : " WIDTH",
            (info->seen_flags & HEIGHT_FLAG) ? "" : " HEIGHT",
            (info->seen_flags & DEPTH_FLAG) ? "" : " DEPTH",
            (info->seen_flags & MAXVAL_FLAG) ? "" : " MAXVAL");
    return 0;
  }
  if (expected_depth != -1 && info->depth != expected_depth) {
    fprintf(stderr, "PAM header error: expected DEPTH %d but got DEPTH %d\n",
            expected_depth, info->depth);
    return 0;
  }
  return off;
}